

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

Gia_Man_t * Gia_ManDupToBarBufs(Gia_Man_t *p,int nBarBufs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  int local_38;
  int local_34;
  int k;
  int i;
  int nPoReal;
  int nPiReal;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nBarBufs_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(p);
  iVar1 = iVar1 - nBarBufs;
  iVar2 = Gia_ManCoNum(p);
  local_38 = 0;
  iVar3 = Gia_ManBufNum(p);
  if (iVar3 != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x138,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar3 = Gia_ManRegNum(p);
  if (iVar3 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x139,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar3 = Gia_ManHasChoices(p);
  if (iVar3 == 0) {
    __assert_fail("Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x13a,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar3 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar3);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  iVar3 = Gia_ManHasChoices(p);
  if (iVar3 != 0) {
    iVar3 = Gia_ManObjNum(p);
    piVar7 = (int *)calloc((long)iVar3,4);
    p_00->pSibls = piVar7;
  }
  Gia_ManFillValue(p);
  pGVar8 = Gia_ManConst0(p);
  pGVar8->Value = 0;
  for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
    uVar4 = Gia_ManAppendCi(p_00);
    pGVar8 = Gia_ManCi(p,local_34);
    pGVar8->Value = uVar4;
  }
  local_34 = 0;
  do {
    bVar9 = false;
    if (local_34 < p->nObjs) {
      _nPoReal = Gia_ManObj(p,local_34);
      bVar9 = _nPoReal != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      for (; local_38 < nBarBufs; local_38 = local_38 + 1) {
        pGVar8 = Gia_ManCo(p,local_38);
        iVar3 = Gia_ObjFanin0Copy(pGVar8);
        if (iVar3 != -1) {
          pGVar8 = Gia_ManCo(p,local_38);
          iVar3 = Gia_ObjFanin0Copy(pGVar8);
          uVar4 = Gia_ManAppendBuf(p_00,iVar3);
          pGVar8 = Gia_ManCi(p,iVar1 + local_38);
          pGVar8->Value = uVar4;
        }
      }
      if (local_38 != nBarBufs) {
        __assert_fail("k == nBarBufs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x152,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
      }
      for (local_34 = 0; local_34 < iVar2 - nBarBufs; local_34 = local_34 + 1) {
        pGVar8 = Gia_ManCo(p,nBarBufs + local_34);
        iVar3 = Gia_ObjFanin0Copy(pGVar8);
        Gia_ManAppendCo(p_00,iVar3);
      }
      iVar3 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar3);
      iVar3 = Gia_ManBufNum(p_00);
      if (iVar3 != nBarBufs) {
        __assert_fail("Gia_ManBufNum(pNew) == nBarBufs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x156,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
      }
      iVar3 = Gia_ManCiNum(p_00);
      if (iVar3 != iVar1) {
        __assert_fail("Gia_ManCiNum(pNew) == nPiReal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x157,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
      }
      iVar1 = Gia_ManCoNum(p_00);
      if (iVar1 != iVar2 - nBarBufs) {
        __assert_fail("Gia_ManCoNum(pNew) == nPoReal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x158,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
      }
      return p_00;
    }
    iVar3 = Gia_ObjIsAnd(_nPoReal);
    if (iVar3 != 0) {
      for (; local_38 < nBarBufs; local_38 = local_38 + 1) {
        pGVar8 = Gia_ManCo(p,local_38);
        pGVar8 = Gia_ObjFanin0(pGVar8);
        if (pGVar8->Value == 0xffffffff) break;
        pGVar8 = Gia_ManCo(p,local_38);
        iVar3 = Gia_ObjFanin0Copy(pGVar8);
        uVar4 = Gia_ManAppendBuf(p_00,iVar3);
        pGVar8 = Gia_ManCi(p,iVar1 + local_38);
        pGVar8->Value = uVar4;
      }
      iVar3 = Gia_ObjFanin0Copy(_nPoReal);
      iVar5 = Gia_ObjFanin1Copy(_nPoReal);
      uVar4 = Gia_ManAppendAnd(p_00,iVar3,iVar5);
      _nPoReal->Value = uVar4;
      iVar3 = Gia_ObjId(p,_nPoReal);
      iVar3 = Gia_ObjSibl(p,iVar3);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjId(p,_nPoReal);
        pGVar8 = Gia_ObjSiblObj(p,iVar3);
        iVar3 = Abc_Lit2Var(pGVar8->Value);
        piVar7 = p_00->pSibls;
        iVar5 = Abc_Lit2Var(_nPoReal->Value);
        piVar7[iVar5] = iVar3;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupToBarBufs( Gia_Man_t * p, int nBarBufs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int nPiReal = Gia_ManCiNum(p) - nBarBufs;
    int nPoReal = Gia_ManCoNum(p) - nBarBufs;
    int i, k = 0;
    assert( Gia_ManBufNum(p) == 0 );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManHasChoices(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPiReal; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        for ( ; k < nBarBufs; k++ )
            if ( ~Gia_ObjFanin0(Gia_ManCo(p, k))->Value )
                Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
            else
                break;
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
    }
    for ( ; k < nBarBufs; k++ )
        if ( ~Gia_ObjFanin0Copy(Gia_ManCo(p, k)) )
            Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
    assert( k == nBarBufs );
    for ( i = 0; i < nPoReal; i++ )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, nBarBufs+i)) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManBufNum(pNew) == nBarBufs );
    assert( Gia_ManCiNum(pNew) == nPiReal );
    assert( Gia_ManCoNum(pNew) == nPoReal );
    return pNew;
}